

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerGenerator.cc
# Opt level: O3

void __thiscall
InstructionInfo::expand
          (InstructionInfo *this,vector<InstructionInfo,_std::allocator<InstructionInfo>_> *out)

{
  uint uVar1;
  pointer pFVar2;
  pointer pcVar3;
  int *piVar4;
  long lVar5;
  InstructionInfo *__x;
  long *plVar6;
  ostream *poVar7;
  vector<Field_*,_std::allocator<Field_*>_> *__range2;
  Field *f;
  pointer pFVar8;
  long *plVar9;
  uint uVar10;
  bool bVar11;
  vector<Field_*,_std::allocator<Field_*>_> expandedFields;
  string saveName;
  ostringstream nstr;
  long *local_218;
  long *plStack_210;
  long local_208;
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  InstructionInfo *local_1d8;
  vector<InstructionInfo,_std::allocator<InstructionInfo>_> *local_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  pointer local_1a8 [14];
  ios_base local_138 [264];
  
  local_218 = (long *)0x0;
  plStack_210 = (long *)0x0;
  local_208 = 0;
  pFVar8 = (this->fields).super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar2 = (this->fields).super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_1d0 = out;
  if (pFVar8 != pFVar2) {
    do {
      if ((pFVar8->match == false) && (pFVar8->expand == true)) {
        pFVar8->match = true;
        pFVar8->value = 0;
        local_1a8[0] = pFVar8;
        std::vector<Field*,std::allocator<Field*>>::emplace_back<Field*>
                  ((vector<Field*,std::allocator<Field*>> *)&local_218,local_1a8);
      }
      pFVar8 = pFVar8 + 1;
    } while (pFVar8 != pFVar2);
  }
  local_1f8 = local_1e8;
  pcVar3 = (this->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,pcVar3,pcVar3 + (this->name)._M_string_length);
  local_1d8 = this;
  do {
    uVar10 = 1;
    plVar6 = local_218;
    while ((plVar6 != plStack_210 && ((char)uVar10 != '\0'))) {
      piVar4 = (int *)*plVar6;
      uVar1 = piVar4[10];
      uVar10 = uVar1 & 1;
      piVar4[10] = uVar10 ^ 1;
      bVar11 = true;
      if ((uVar1 & 1) == 0) {
        bVar11 = piVar4[1] - *piVar4 == 1;
      }
      *(bool *)(piVar4 + 0xb) = bVar11;
      plVar6 = plVar6 + 1;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_1f8,local_1f0);
    plVar6 = plStack_210;
    *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
         *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 8;
    for (plVar9 = local_218; plVar9 != plVar6; plVar9 = plVar9 + 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    }
    std::__cxx11::stringbuf::str();
    __x = local_1d8;
    std::__cxx11::string::operator=((string *)local_1d8,(string *)local_1c8);
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    std::vector<InstructionInfo,_std::allocator<InstructionInfo>_>::push_back(local_1d0,__x);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  } while (uVar10 == 0);
  std::__cxx11::string::_M_assign((string *)__x);
  for (plVar6 = local_218; plVar6 != plStack_210; plVar6 = plVar6 + 1) {
    lVar5 = *plVar6;
    *(undefined1 *)(lVar5 + 0x2c) = 0;
    *(undefined4 *)(lVar5 + 0x28) = 0;
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  if (local_218 != (long *)0x0) {
    operator_delete(local_218,local_208 - (long)local_218);
  }
  return;
}

Assistant:

void InstructionInfo::expand(std::vector<InstructionInfo>& out)
{
    std::vector<Field*> expandedFields;
    for(Field& f : fields)
    {
        if(f.match || !f.expand)
            continue;
        f.match = true;
        f.value = 0;
        expandedFields.push_back(&f);
    }
    
    bool carry;
    std::string saveName = name;
    
    do
    {
        carry = true;

        for(Field *f : expandedFields)
        {
            if(!carry)
                break;
            
            //uint32_t mask = ((uint32_t)1U << (uint32_t)f->bitsize()) - 1U;
            f->value = (f->value + 1) & 1; //mask;
            carry = f->value == 0;

            if(f->value == 0 || f->bitsize() == 1)
            {
                f->match = true;
            }
            else
            {
                f->match = false;
            }
        }

        std::ostringstream nstr;
        nstr << saveName << std::hex;
        for(Field *f : expandedFields)
            nstr << "_" << f->value;
        name = nstr.str();
        out.push_back(*this);
    } while(!carry);
    
    name = saveName;
    
    for(Field *f : expandedFields)
    {
        f->match = false;
        f->value = 0;
    }
}